

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  ulong uVar1;
  int iVar2;
  ulong *puVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  bool in_CL;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  long lVar8;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(Descriptor *)0x0,in_CL);
  Options::Options(&this->options_,options);
  FieldGeneratorMap::FieldGeneratorMap(&this->field_generators_,descriptor,options);
  iVar2 = *(int *)(descriptor + 0x38);
  uVar6 = (ulong)iVar2;
  uVar1 = uVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if ((long)uVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = uVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(puVar3 + 1),0,uVar1);
  }
  (this->nested_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(puVar3 + 1);
  iVar2 = *(int *)(descriptor + 0x48);
  lVar7 = (long)iVar2;
  uVar1 = lVar7 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar7 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar7;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->enum_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(descriptor + 0x68);
  lVar7 = (long)iVar2;
  uVar1 = lVar7 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar7 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar7;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1);
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar7);
    this_01 = (MessageGenerator *)operator_new(0x78);
    MessageGenerator(this_01,(Descriptor *)(*(long *)(descriptor + 0x40) + lVar8),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset(this_00,this_01);
    uVar6 = (ulong)*(uint *)(descriptor + 0x38);
    lVar8 = lVar8 + 0x78;
  }
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(descriptor + 0x48); lVar7 = lVar7 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar7);
    this_03 = (EnumGenerator *)operator_new(0x50);
    EnumGenerator::EnumGenerator
              (this_03,(EnumDescriptor *)(*(long *)(descriptor + 0x50) + lVar8),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(this_02,this_03);
    lVar8 = lVar8 + 0x38;
  }
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(descriptor + 0x68); lVar7 = lVar7 + 1) {
    this_04 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar7);
    this_05 = (ExtensionGenerator *)operator_new(0x50);
    ExtensionGenerator::ExtensionGenerator
              (this_05,(FieldDescriptor *)(*(long *)(descriptor + 0x70) + lVar8),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset
              (this_04,this_05);
    lVar8 = lVar8 + 0x78;
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    field_generators_(descriptor, options),
    nested_generators_(new scoped_ptr<MessageGenerator>[
      descriptor->nested_type_count()]),
    enum_generators_(new scoped_ptr<EnumGenerator>[
      descriptor->enum_type_count()]),
    extension_generators_(new scoped_ptr<ExtensionGenerator>[
      descriptor->extension_count()]) {

  for (int i = 0; i < descriptor->nested_type_count(); i++) {
    nested_generators_[i].reset(
      new MessageGenerator(descriptor->nested_type(i), options));
  }

  for (int i = 0; i < descriptor->enum_type_count(); i++) {
    enum_generators_[i].reset(
      new EnumGenerator(descriptor->enum_type(i), options));
  }

  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
      new ExtensionGenerator(descriptor->extension(i), options));
  }
}